

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O3

void uv__signal_unregister_handler(int signum)

{
  int iVar1;
  undefined1 local_a8 [8];
  sigaction sa;
  int signum_local;
  
  sa.sa_restorer._4_4_ = signum;
  iVar1 = uv__sigaction_isset(signum);
  if (iVar1 == 0) {
    __assert_fail("uv__sigaction_isset(signum)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/signal.c"
                  ,0x10e,"void uv__signal_unregister_handler(int)");
  }
  memcpy(local_a8,uv__sigactions.acts + sa.sa_restorer._4_4_,0x98);
  iVar1 = sigaction(sa.sa_restorer._4_4_,(sigaction *)local_a8,(sigaction *)0x0);
  if (iVar1 != 0) {
    abort();
  }
  return;
}

Assistant:

static void uv__signal_unregister_handler(int signum) {
  /* When this function is called, the signal lock must be held. */
  struct sigaction sa;
  
  assert(uv__sigaction_isset(signum));
  
  sa = uv__sigactions.acts[signum];

  /* sigaction can only fail with EINVAL or EFAULT; an attempt to deregister a
   * signal implies that it was successfully registered earlier, so EINVAL
   * should never happen.
   */
  if (sigaction(signum, &sa, NULL))
    abort();
}